

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v10::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  uint local_4c;
  uint max;
  long num_digits;
  char *p;
  uint local_28;
  uint prev;
  uint value;
  int error_value_local;
  char *end_local;
  char **begin_local;
  
  if (((*begin == end) || (**begin < '0')) || ('9' < **begin)) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                ,0x87e,"");
  }
  local_28 = 0;
  pcVar3 = *begin;
  begin_local._4_4_ = local_28;
  do {
    local_28 = begin_local._4_4_;
    num_digits = (long)pcVar3;
    begin_local._4_4_ = local_28 * 10 + *(char *)num_digits + -0x30;
    pcVar3 = (char *)(num_digits + 1);
    bVar2 = false;
    if ((pcVar3 != end) && (bVar2 = false, '/' < *pcVar3)) {
      bVar2 = *pcVar3 < ':';
    }
  } while (bVar2);
  pcVar1 = *begin;
  *begin = pcVar3;
  if (9 < (long)pcVar3 - (long)pcVar1) {
    local_4c = error_value;
    if (((long)pcVar3 - (long)pcVar1 == 10) &&
       ((ulong)local_28 * 10 + (ulong)((int)*(char *)num_digits - 0x30) < 0x80000000)) {
      local_4c = begin_local._4_4_;
    }
    begin_local._4_4_ = local_4c;
  }
  return begin_local._4_4_;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}